

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters.h
# Opt level: O0

void __thiscall
lwlog::details::hour_clock_24_formatter::hour_clock_24_formatter(hour_clock_24_formatter *this)

{
  hour_clock_24_formatter *this_local;
  
  formatter::formatter(&this->super_formatter);
  (this->super_formatter)._vptr_formatter = (_func_int **)&PTR__hour_clock_24_formatter_0015f7f8;
  return;
}

Assistant:

void format(std::string& pattern, const record_base& record) const override
		{
			const auto& time_point{ record.time_point() };

			formatter::format_attribute(
				pattern,
				flag::hour_clock_24,
				os::datetime::ensure_two_digit_format(time_point.hour) 
					+ '-'  + os::datetime::ensure_two_digit_format(time_point.minute)
			);
		}